

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch_reporter_junit.hpp
# Opt level: O3

void __thiscall
Catch::JunitReporter::writeSection
          (JunitReporter *this,string *className,string *rootName,SectionNode *sectionNode)

{
  XmlWriter *this_00;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  pointer pcVar3;
  pointer pAVar4;
  pointer pPVar5;
  long *plVar6;
  size_type *psVar7;
  pointer pPVar8;
  pointer stats;
  char *__end;
  ScopedElement scoped;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> __str;
  ScopedElement e;
  string name;
  string local_b0;
  ScopedElement local_90;
  string *local_88;
  JunitReporter *local_80;
  string local_78;
  ScopedElement local_58;
  string local_50;
  
  local_88 = className;
  local_80 = this;
  trim(&local_50,&(sectionNode->stats).sectionInfo.name);
  if (rootName->_M_string_length != 0) {
    pcVar3 = (rootName->_M_dataplus)._M_p;
    local_78._M_dataplus._M_p = (pointer)&local_78.field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_78,pcVar3,pcVar3 + rootName->_M_string_length);
    std::__cxx11::string::append((char *)&local_78);
    plVar6 = (long *)std::__cxx11::string::_M_append
                               ((char *)&local_78,(ulong)local_50._M_dataplus._M_p);
    psVar7 = (size_type *)(plVar6 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*plVar6 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)psVar7) {
      local_b0.field_2._M_allocated_capacity = *psVar7;
      local_b0.field_2._8_8_ = plVar6[3];
      local_b0._M_dataplus._M_p = (pointer)&local_b0.field_2;
    }
    else {
      local_b0.field_2._M_allocated_capacity = *psVar7;
      local_b0._M_dataplus._M_p = (pointer)*plVar6;
    }
    local_b0._M_string_length = plVar6[1];
    *plVar6 = (long)psVar7;
    plVar6[1] = 0;
    *(undefined1 *)(plVar6 + 2) = 0;
    std::__cxx11::string::operator=((string *)&local_50,(string *)&local_b0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_b0._M_dataplus._M_p != &local_b0.field_2) {
      operator_delete(local_b0._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_78._M_dataplus._M_p != &local_78.field_2) {
      operator_delete(local_78._M_dataplus._M_p);
    }
  }
  if ((((sectionNode->assertions).
        super__Vector_base<Catch::AssertionStats,_std::allocator<Catch::AssertionStats>_>._M_impl.
        super__Vector_impl_data._M_start !=
        (sectionNode->assertions).
        super__Vector_base<Catch::AssertionStats,_std::allocator<Catch::AssertionStats>_>._M_impl.
        super__Vector_impl_data._M_finish) || ((sectionNode->stdOut)._M_string_length != 0)) ||
     ((sectionNode->stdErr)._M_string_length != 0)) {
    paVar1 = &local_b0.field_2;
    local_b0._M_dataplus._M_p = (pointer)paVar1;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_b0,"testcase","");
    this_00 = &local_80->xml;
    local_58.m_writer = this_00;
    XmlWriter::startElement(this_00,&local_b0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_b0._M_dataplus._M_p != paVar1) {
      operator_delete(local_b0._M_dataplus._M_p);
    }
    if (local_88->_M_string_length == 0) {
      local_b0._M_dataplus._M_p = (pointer)paVar1;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_b0,"classname","");
      XmlWriter::writeAttribute(this_00,&local_b0,&local_50);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_b0._M_dataplus._M_p != paVar1) {
        operator_delete(local_b0._M_dataplus._M_p);
      }
      local_b0._M_dataplus._M_p = (pointer)paVar1;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_b0,"name","");
      XmlWriter::writeAttribute<char[5]>(this_00,&local_b0,(char (*) [5])"root");
    }
    else {
      local_b0._M_dataplus._M_p = (pointer)paVar1;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_b0,"classname","");
      XmlWriter::writeAttribute(this_00,&local_b0,local_88);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_b0._M_dataplus._M_p != paVar1) {
        operator_delete(local_b0._M_dataplus._M_p);
      }
      local_b0._M_dataplus._M_p = (pointer)paVar1;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_b0,"name","");
      XmlWriter::writeAttribute(this_00,&local_b0,&local_50);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_b0._M_dataplus._M_p != paVar1) {
      operator_delete(local_b0._M_dataplus._M_p);
    }
    local_b0._M_dataplus._M_p = (pointer)paVar1;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_b0,"time","");
    fpToString<double>(&local_78,(sectionNode->stats).durationInSeconds,10);
    XmlWriter::writeAttribute(this_00,&local_b0,&local_78);
    paVar2 = &local_78.field_2;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_78._M_dataplus._M_p != paVar2) {
      operator_delete(local_78._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_b0._M_dataplus._M_p != paVar1) {
      operator_delete(local_b0._M_dataplus._M_p);
    }
    pAVar4 = (sectionNode->assertions).
             super__Vector_base<Catch::AssertionStats,_std::allocator<Catch::AssertionStats>_>.
             _M_impl.super__Vector_impl_data._M_finish;
    for (stats = (sectionNode->assertions).
                 super__Vector_base<Catch::AssertionStats,_std::allocator<Catch::AssertionStats>_>.
                 _M_impl.super__Vector_impl_data._M_start; stats != pAVar4; stats = stats + 1) {
      writeAssertion(local_80,stats);
    }
    if ((sectionNode->stdOut)._M_string_length != 0) {
      local_b0._M_dataplus._M_p = (pointer)paVar1;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_b0,"system-out","");
      local_90.m_writer = this_00;
      XmlWriter::startElement(this_00,&local_b0);
      trim(&local_78,&sectionNode->stdOut);
      XmlWriter::writeText(local_90.m_writer,&local_78,false);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_78._M_dataplus._M_p != paVar2) {
        operator_delete(local_78._M_dataplus._M_p);
      }
      XmlWriter::ScopedElement::~ScopedElement(&local_90);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_b0._M_dataplus._M_p != paVar1) {
        operator_delete(local_b0._M_dataplus._M_p);
      }
    }
    if ((sectionNode->stdErr)._M_string_length != 0) {
      local_b0._M_dataplus._M_p = (pointer)paVar1;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_b0,"system-err","");
      local_90.m_writer = this_00;
      XmlWriter::startElement(this_00,&local_b0);
      trim(&local_78,&sectionNode->stdErr);
      XmlWriter::writeText(local_90.m_writer,&local_78,false);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_78._M_dataplus._M_p != paVar2) {
        operator_delete(local_78._M_dataplus._M_p);
      }
      XmlWriter::ScopedElement::~ScopedElement(&local_90);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_b0._M_dataplus._M_p != paVar1) {
        operator_delete(local_b0._M_dataplus._M_p);
      }
    }
    XmlWriter::ScopedElement::~ScopedElement(&local_58);
  }
  pPVar8 = (sectionNode->childSections).
           super__Vector_base<Catch::Ptr<Catch::CumulativeReporterBase::SectionNode>,_std::allocator<Catch::Ptr<Catch::CumulativeReporterBase::SectionNode>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  pPVar5 = (sectionNode->childSections).
           super__Vector_base<Catch::Ptr<Catch::CumulativeReporterBase::SectionNode>,_std::allocator<Catch::Ptr<Catch::CumulativeReporterBase::SectionNode>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  if (pPVar8 != pPVar5) {
    do {
      if (local_88->_M_string_length == 0) {
        local_b0._M_dataplus._M_p = (pointer)&local_b0.field_2;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_b0,"","");
        writeSection(local_80,&local_50,&local_b0,pPVar8->m_p);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_b0._M_dataplus._M_p != &local_b0.field_2) {
          operator_delete(local_b0._M_dataplus._M_p);
        }
      }
      else {
        writeSection(local_80,local_88,&local_50,pPVar8->m_p);
      }
      pPVar8 = pPVar8 + 1;
    } while (pPVar8 != pPVar5);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != &local_50.field_2) {
    operator_delete(local_50._M_dataplus._M_p);
  }
  return;
}

Assistant:

void writeSection(  std::string const& className,
                            std::string const& rootName,
                            SectionNode const& sectionNode ) {
            std::string name = trim( sectionNode.stats.sectionInfo.name );
            if( !rootName.empty() )
                name = rootName + "/" + name;
            
            if( !sectionNode.assertions.empty() ||
                !sectionNode.stdOut.empty() ||
                !sectionNode.stdErr.empty() ) {
                XmlWriter::ScopedElement e = xml.scopedElement( "testcase" );
                if( className.empty() ) {
                    xml.writeAttribute( "classname", name );
                    xml.writeAttribute( "name", "root" );
                }
                else {
                    xml.writeAttribute( "classname", className );
                    xml.writeAttribute( "name", name );
                }
                xml.writeAttribute( "time", Catch::toString( sectionNode.stats.durationInSeconds ) );

                writeAssertions( sectionNode );

                if( !sectionNode.stdOut.empty() )
                    xml.scopedElement( "system-out" ).writeText( trim( sectionNode.stdOut ), false );
                if( !sectionNode.stdErr.empty() )
                    xml.scopedElement( "system-err" ).writeText( trim( sectionNode.stdErr ), false );
            }
            for( SectionNode::ChildSections::const_iterator
                    it = sectionNode.childSections.begin(),
                    itEnd = sectionNode.childSections.end();
                    it != itEnd;
                    ++it )
                if( className.empty() )
                    writeSection( name, "", **it );
                else
                    writeSection( className, name, **it );
        }